

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void __thiscall benchmark::internal::BenchmarkImp::UseRealTime(BenchmarkImp *this)

{
  bool bVar1;
  CheckHandler local_20;
  
  bVar1 = this->use_manual_time_;
  if (bVar1 == false) {
    local_20.log_ = GetNullLogInstance();
  }
  else {
    CheckHandler::CheckHandler
              (&local_20,"!use_manual_time_",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"UseRealTime",0x256);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_20.log_,"Cannot set UseRealTime and UseManualTime simultaneously.",0x38);
  if (bVar1 == false) {
    this->use_real_time_ = true;
    return;
  }
  CheckHandler::~CheckHandler(&local_20);
}

Assistant:

void BenchmarkImp::UseRealTime() {
  CHECK(!use_manual_time_) << "Cannot set UseRealTime and UseManualTime simultaneously.";
  use_real_time_ = true;
}